

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O1

void psh_globals_set_scale
               (PSH_Globals globals,FT_Fixed x_scale,FT_Fixed y_scale,FT_Fixed x_delta,
               FT_Fixed y_delta)

{
  PSH_BluesRec *pPVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  PSH_BluesRec *pPVar6;
  PSH_Blue_ZoneRec *pPVar7;
  FT_UInt FVar8;
  int iVar9;
  int iVar10;
  FT_Pos *pFVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  
  if ((globals->dimension[0].scale_mult != x_scale) ||
     (globals->dimension[0].scale_delta != x_delta)) {
    globals->dimension[0].scale_mult = x_scale;
    globals->dimension[0].scale_delta = x_delta;
    psh_globals_scale_widths(globals,0);
  }
  if ((globals->dimension[1].scale_mult != y_scale) ||
     (globals->dimension[1].scale_delta != y_delta)) {
    globals->dimension[1].scale_mult = y_scale;
    globals->dimension[1].scale_delta = y_delta;
    psh_globals_scale_widths(globals,1);
    if (y_scale < 0x20c49ba) {
      bVar15 = y_scale * 0x7d < (globals->blues).blue_scale * 8;
    }
    else {
      bVar15 = y_scale < ((globals->blues).blue_scale << 3) / 0x7d;
    }
    (globals->blues).no_overshoots = bVar15;
    uVar3 = (globals->blues).blue_shift;
    if (0 < (int)uVar3) {
      do {
        lVar4 = (ulong)uVar3 * (long)(int)y_scale;
        if ((int)((ulong)(lVar4 + (lVar4 >> 0x3f) + 0x8000) >> 0x10) < 0x21) goto LAB_0021405e;
        bVar15 = 1 < (int)uVar3;
        uVar3 = uVar3 - 1;
      } while (bVar15);
      uVar3 = 0;
    }
LAB_0021405e:
    pPVar1 = &globals->blues;
    (globals->blues).blue_threshold = uVar3;
    lVar4 = (long)(int)y_scale;
    iVar5 = 0;
    do {
      pPVar6 = pPVar1;
      if (((iVar5 != 0) && (pPVar6 = (PSH_BluesRec *)&(globals->blues).family_top, iVar5 != 2)) &&
         (pPVar6 = (PSH_BluesRec *)&(globals->blues).normal_bottom, iVar5 != 1)) {
        pPVar6 = (PSH_BluesRec *)&(globals->blues).family_bottom;
      }
      FVar8 = (pPVar6->normal_top).count;
      if (FVar8 != 0) {
        pPVar7 = (pPVar6->normal_top).zones;
        do {
          lVar13 = pPVar7->org_top * lVar4;
          pPVar7->cur_top = (int)((ulong)(lVar13 + 0x8000 + (lVar13 >> 0x3f)) >> 0x10) + y_delta;
          lVar13 = pPVar7->org_bottom * lVar4;
          pPVar7->cur_bottom = (int)((ulong)(lVar13 + 0x8000 + (lVar13 >> 0x3f)) >> 0x10) + y_delta;
          lVar14 = pPVar7->org_ref * lVar4;
          lVar13 = pPVar7->org_delta * lVar4;
          pPVar7->cur_delta = (long)(int)((ulong)(lVar13 + 0x8000 + (lVar13 >> 0x3f)) >> 0x10);
          pPVar7->cur_ref =
               (int)((ulong)(lVar14 + 0x8000 + (lVar14 >> 0x3f)) >> 0x10) + y_delta + 0x20U &
               0xffffffffffffffc0;
          pPVar7 = pPVar7 + 1;
          FVar8 = FVar8 - 1;
        } while (FVar8 != 0);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != 4);
    iVar5 = 0;
    do {
      pPVar6 = (PSH_BluesRec *)&(globals->blues).normal_bottom;
      if (iVar5 == 0) {
        pPVar6 = pPVar1;
      }
      FVar8 = (pPVar6->normal_top).count;
      if (FVar8 != 0) {
        pPVar7 = (pPVar6->normal_top).zones;
        lVar13 = 0x918;
        if (iVar5 == 0) {
          lVar13 = 0x610;
        }
        iVar2 = *(int *)((long)(pPVar1->normal_top).zones + lVar13 + -8);
        do {
          if (iVar2 != 0) {
            pFVar11 = (FT_Pos *)((long)&(globals->blues).normal_top.zones[0].cur_top + lVar13);
            iVar9 = iVar2;
            do {
              iVar12 = pPVar7->org_ref - (int)pFVar11[-5];
              iVar10 = -iVar12;
              if (0 < iVar12) {
                iVar10 = iVar12;
              }
              if ((int)((ulong)(iVar10 * lVar4 + (iVar10 * lVar4 >> 0x3f) + 0x8000) >> 0x10) < 0x40)
              {
                pPVar7->cur_top = *pFVar11;
                pPVar7->cur_bottom = pFVar11[-1];
                pPVar7->cur_ref = pFVar11[-3];
                pPVar7->cur_delta = pFVar11[-2];
                break;
              }
              pFVar11 = pFVar11 + 6;
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
          }
          pPVar7 = pPVar7 + 1;
          FVar8 = FVar8 - 1;
        } while (FVar8 != 0);
      }
      bVar15 = iVar5 == 0;
      iVar5 = iVar5 + 1;
    } while (bVar15);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  psh_globals_set_scale( PSH_Globals  globals,
                         FT_Fixed     x_scale,
                         FT_Fixed     y_scale,
                         FT_Fixed     x_delta,
                         FT_Fixed     y_delta )
  {
    PSH_Dimension  dim;


    dim = &globals->dimension[0];
    if ( x_scale != dim->scale_mult  ||
         x_delta != dim->scale_delta )
    {
      dim->scale_mult  = x_scale;
      dim->scale_delta = x_delta;

      psh_globals_scale_widths( globals, 0 );
    }

    dim = &globals->dimension[1];
    if ( y_scale != dim->scale_mult  ||
         y_delta != dim->scale_delta )
    {
      dim->scale_mult  = y_scale;
      dim->scale_delta = y_delta;

      psh_globals_scale_widths( globals, 1 );
      psh_blues_scale_zones( &globals->blues, y_scale, y_delta );
    }
  }